

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporterPtr Catch::anon_unknown_1::makeReporter(shared_ptr<Catch::Config> *config)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *peVar4;
  element_type *peVar5;
  string *reporter;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> in_RDI;
  shared_ptr<Catch::IReporterFactory> *listener;
  const_iterator __end2;
  const_iterator __begin2;
  Listeners *__range2;
  Listeners *listeners;
  ListeningReporter *multi;
  unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_> *ret;
  vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
  *in_stack_fffffffffffffed8;
  ListeningReporter *in_stack_fffffffffffffee0;
  shared_ptr<const_Catch::IConfig> *this;
  vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
  *in_stack_fffffffffffffef0;
  ListeningReporter *this_00;
  IStreamingReporter in_stack_ffffffffffffff58;
  undefined1 local_80 [24];
  undefined1 local_68 [8];
  reference local_60;
  shared_ptr<Catch::IReporterFactory> *local_58;
  __normal_iterator<const_std::shared_ptr<Catch::IReporterFactory>_*,_std::vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>_>
  local_50;
  undefined8 local_48;
  undefined8 local_40;
  shared_ptr<const_Catch::IConfig> *local_38;
  undefined1 local_2d;
  
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))();
  bVar1 = clara::std::
          vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
          ::empty(in_stack_fffffffffffffef0);
  if (bVar1) {
    peVar5 = clara::std::
             __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x148c49);
    Config::getReporterName_abi_cxx11_(peVar5);
    std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
              ((shared_ptr<const_Catch::IConfig> *)in_stack_fffffffffffffee0,
               (shared_ptr<Catch::Config> *)in_stack_fffffffffffffed8);
    createReporter((string *)in_stack_ffffffffffffff58._vptr_IStreamingReporter,
                   (IConfigPtr *)in_RDI._M_head_impl);
    clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
              ((shared_ptr<const_Catch::IConfig> *)0x148c93);
  }
  else {
    local_2d = 0;
    operator_new(0x30);
    ListeningReporter::ListeningReporter(in_stack_fffffffffffffee0);
    std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>::
    unique_ptr<std::default_delete<Catch::IStreamingReporter>,void>
              ((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                *)in_stack_fffffffffffffee0,(pointer)in_stack_fffffffffffffed8);
    local_38 = (shared_ptr<const_Catch::IConfig> *)
               clara::std::
               unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
               ::operator*((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                            *)in_stack_fffffffffffffee0);
    pIVar3 = getRegistryHub();
    iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
    local_48 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x20))();
    local_40 = local_48;
    local_50._M_current =
         (shared_ptr<Catch::IReporterFactory> *)
         clara::std::
         vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
         ::begin(in_stack_fffffffffffffed8);
    local_58 = (shared_ptr<Catch::IReporterFactory> *)
               clara::std::
               vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
               ::end(in_stack_fffffffffffffed8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<Catch::IReporterFactory>_*,_std::vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>_>
                               *)in_stack_fffffffffffffee0,
                              (__normal_iterator<const_std::shared_ptr<Catch::IReporterFactory>_*,_std::vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>_>
                               *)in_stack_fffffffffffffed8), bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<Catch::IReporterFactory>_*,_std::vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>_>
                 ::operator*(&local_50);
      peVar4 = clara::std::
               __shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x148dd9);
      std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
                ((shared_ptr<const_Catch::IConfig> *)in_stack_fffffffffffffee0,
                 (shared_ptr<Catch::Config> *)in_stack_fffffffffffffed8);
      ReporterConfig::ReporterConfig
                ((ReporterConfig *)in_stack_fffffffffffffee0,(IConfigPtr *)in_stack_fffffffffffffed8
                );
      (*peVar4->_vptr_IReporterFactory[2])(local_68,peVar4,local_80);
      ListeningReporter::addListener
                (in_stack_fffffffffffffee0,(IStreamingReporterPtr *)in_stack_fffffffffffffed8);
      clara::std::
      unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
      ~unique_ptr((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                   *)in_stack_fffffffffffffee0);
      ReporterConfig::~ReporterConfig((ReporterConfig *)0x148e5a);
      clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
                ((shared_ptr<const_Catch::IConfig> *)0x148e67);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Catch::IReporterFactory>_*,_std::vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>_>
      ::operator++(&local_50);
    }
    this = local_38;
    peVar5 = clara::std::
             __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x148f40);
    reporter = Config::getReporterName_abi_cxx11_(peVar5);
    this_00 = (ListeningReporter *)&stack0xffffffffffffff58;
    std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
              (this,(shared_ptr<Catch::Config> *)in_stack_fffffffffffffed8);
    createReporter((string *)in_stack_ffffffffffffff58._vptr_IStreamingReporter,
                   (IConfigPtr *)in_RDI._M_head_impl);
    ListeningReporter::addReporter(this_00,(IStreamingReporterPtr *)reporter);
    clara::std::
    unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
    ~unique_ptr((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                 *)this);
    clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
              ((shared_ptr<const_Catch::IConfig> *)0x148fae);
  }
  return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
          )(tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
           in_RDI._M_head_impl;
}

Assistant:

IStreamingReporterPtr makeReporter(std::shared_ptr<Config> const& config) {
            if (Catch::getRegistryHub().getReporterRegistry().getListeners().empty()) {
                return createReporter(config->getReporterName(), config);
            }

            // On older platforms, returning std::unique_ptr<ListeningReporter>
            // when the return type is std::unique_ptr<IStreamingReporter>
            // doesn't compile without a std::move call. However, this causes
            // a warning on newer platforms. Thus, we have to work around
            // it a bit and downcast the pointer manually.
            auto ret = std::unique_ptr<IStreamingReporter>(new ListeningReporter);
            auto& multi = static_cast<ListeningReporter&>(*ret);
            auto const& listeners = Catch::getRegistryHub().getReporterRegistry().getListeners();
            for (auto const& listener : listeners) {
                multi.addListener(listener->create(Catch::ReporterConfig(config)));
            }
            multi.addReporter(createReporter(config->getReporterName(), config));
            return ret;
        }